

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:685:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:685:17)>
             *this)

{
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *pMVar1;
  Executor *pEVar2;
  long in_FS_OFFSET;
  PredicateImpl_conflict impl;
  EventLoop loop;
  UnixEventPort port;
  undefined1 local_1b1;
  undefined **local_1b0;
  undefined1 *local_1a8;
  Maybe<const_kj::Executor_&> *local_1a0;
  undefined1 local_198;
  EventLoop local_188;
  UnixEventPort local_110;
  
  *(undefined1 *)(in_FS_OFFSET + -0x39) = 1;
  UnixEventPort::UnixEventPort(&local_110);
  EventLoop::EventLoop(&local_188,&local_110.super_EventPort);
  EventLoop::enterScope(&local_188);
  pEVar2 = getCurrentThreadExecutor();
  pMVar1 = (this->f).executor;
  local_1b0 = (undefined **)((ulong)local_1b0 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar1->mutex);
  (pMVar1->value).ptr = pEVar2;
  kj::_::Mutex::unlock(&pMVar1->mutex,EXCLUSIVE,(Waiter *)0x0);
  pMVar1 = (this->f).executor;
  local_1b0 = (undefined **)((ulong)local_1b0 & 0xffffffffffffff00);
  kj::_::Mutex::lock(&pMVar1->mutex,0);
  local_1a0 = &pMVar1->value;
  local_1b0 = &PTR_check_0060bf40;
  local_1a8 = &local_1b1;
  local_198 = 0;
  kj::_::Mutex::wait(&pMVar1->mutex,&local_1b0);
  kj::_::Mutex::unlock(&pMVar1->mutex,EXCLUSIVE,(Waiter *)0x0);
  EventLoop::leaveScope(&local_188);
  EventLoop::~EventLoop(&local_188);
  UnixEventPort::~UnixEventPort(&local_110);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }